

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly1305_key(poly1305 *ctx,ptrlen key)

{
  ulong *puVar1;
  ulong local_38;
  uchar key_copy [16];
  poly1305 *ctx_local;
  ptrlen key_local;
  
  puVar1 = (ulong *)key.ptr;
  if (key.len == 0x20) {
    local_38 = *puVar1 & 0xffffffc0fffffff;
    key_copy._0_8_ = puVar1[1] & 0xffffffc0ffffffc;
    bigval_import_le(&ctx->r,&local_38,0x10);
    smemclr(&local_38,0x10);
    *(ulong *)ctx->nonce = puVar1[2];
    *(ulong *)(ctx->nonce + 8) = puVar1[3];
    return;
  }
  __assert_fail("key.len == 32",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/chacha20-poly1305.c"
                ,0x309,"void poly1305_key(struct poly1305 *, ptrlen)");
}

Assistant:

static void poly1305_key(struct poly1305 *ctx, ptrlen key)
{
    assert(key.len == 32);             /* Takes a 256 bit key */

    unsigned char key_copy[16];
    memcpy(key_copy, key.ptr, 16);

    /* Key the MAC itself
     * bytes 4, 8, 12 and 16 are required to have their top four bits clear */
    key_copy[3] &= 0x0f;
    key_copy[7] &= 0x0f;
    key_copy[11] &= 0x0f;
    key_copy[15] &= 0x0f;
    /* bytes 5, 9 and 13 are required to have their bottom two bits clear */
    key_copy[4] &= 0xfc;
    key_copy[8] &= 0xfc;
    key_copy[12] &= 0xfc;
    bigval_import_le(&ctx->r, key_copy, 16);
    smemclr(key_copy, sizeof(key_copy));

    /* Use second 128 bits as the nonce */
    memcpy(ctx->nonce, (const char *)key.ptr + 16, 16);
}